

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swish_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::Swish_x86_avx::forward_inplace(Swish_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  int iVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  int iVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  undefined1 (*pauVar12) [32];
  ulong uVar13;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar27 [16];
  undefined1 extraout_var [60];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar34;
  float fVar35;
  float fVar37;
  float fVar38;
  float fVar39;
  undefined1 auVar32 [32];
  float fVar36;
  undefined1 auVar33 [32];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  float fVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [64];
  undefined1 local_128 [16];
  float local_d8;
  undefined1 auVar19 [32];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  undefined1 extraout_var_04 [60];
  
  iVar2 = bottom_top_blob->c;
  if (0 < (long)iVar2) {
    uVar10 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    lVar11 = 0;
    auVar53 = ZEXT3264(CONCAT428(0x3f800000,
                                 CONCAT424(0x3f800000,
                                           CONCAT420(0x3f800000,
                                                     CONCAT416(0x3f800000,
                                                               CONCAT412(0x3f800000,
                                                                         CONCAT48(0x3f800000,
                                                                                  0x3f8000003f800000
                                                                                 )))))));
    do {
      auVar50._8_4_ = 0xc2b0c0a5;
      auVar50._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar44._8_4_ = 0x42b0c0a5;
      auVar44._0_8_ = 0x42b0c0a542b0c0a5;
      auVar50._12_4_ = 0xc2b0c0a5;
      auVar44._12_4_ = 0x42b0c0a5;
      auVar50._16_4_ = 0xc2b0c0a5;
      auVar44._16_4_ = 0x42b0c0a5;
      auVar50._20_4_ = 0xc2b0c0a5;
      auVar44._20_4_ = 0x42b0c0a5;
      auVar50._24_4_ = 0xc2b0c0a5;
      auVar44._24_4_ = 0x42b0c0a5;
      auVar50._28_4_ = 0xc2b0c0a5;
      auVar44._28_4_ = 0x42b0c0a5;
      pauVar12 = (undefined1 (*) [32])
                 (bottom_top_blob->cstep * lVar11 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      if ((int)uVar10 < 8) {
        uVar7 = 0;
      }
      else {
        iVar6 = 7;
        do {
          auVar17 = *pauVar12;
          auVar32._0_8_ = auVar17._0_8_ ^ 0x8000000080000000;
          auVar32._8_4_ = -auVar17._8_4_;
          auVar32._12_4_ = -auVar17._12_4_;
          auVar32._16_4_ = -auVar17._16_4_;
          auVar32._20_4_ = -auVar17._20_4_;
          auVar32._24_4_ = -auVar17._24_4_;
          auVar32._28_4_ = auVar17._28_4_ ^ 0x80000000;
          auVar32 = vminps_avx(auVar32,auVar44);
          auVar3 = vmaxps_avx(auVar32,auVar50);
          auVar45._0_4_ = auVar3._0_4_ * 1.442695 + 0.5;
          auVar45._4_4_ = auVar3._4_4_ * 1.442695 + 0.5;
          auVar45._8_4_ = auVar3._8_4_ * 1.442695 + 0.5;
          auVar45._12_4_ = auVar3._12_4_ * 1.442695 + 0.5;
          auVar45._16_4_ = auVar3._16_4_ * 1.442695 + 0.5;
          auVar45._20_4_ = auVar3._20_4_ * 1.442695 + 0.5;
          auVar45._24_4_ = auVar3._24_4_ * 1.442695 + 0.5;
          auVar45._28_4_ = 0x42b1c0a5;
          auVar33 = vroundps_avx(auVar45,1);
          auVar32 = vcmpps_avx(auVar45,auVar33,1);
          auVar32 = vandps_avx(auVar53._0_32_,auVar32);
          auVar32 = vsubps_avx(auVar33,auVar32);
          fVar28 = auVar3._0_4_ + auVar32._0_4_ * -0.6931472;
          fVar34 = auVar3._4_4_ + auVar32._4_4_ * -0.6931472;
          fVar35 = auVar3._8_4_ + auVar32._8_4_ * -0.6931472;
          fVar36 = auVar3._12_4_ + auVar32._12_4_ * -0.6931472;
          fVar37 = auVar3._16_4_ + auVar32._16_4_ * -0.6931472;
          fVar38 = auVar3._20_4_ + auVar32._20_4_ * -0.6931472;
          fVar39 = auVar3._24_4_ + auVar32._24_4_ * -0.6931472;
          auVar40._0_4_ = (int)auVar32._0_4_;
          auVar40._4_4_ = (int)auVar32._4_4_;
          auVar40._8_4_ = (int)auVar32._8_4_;
          auVar40._12_4_ = (int)auVar32._12_4_;
          auVar46._16_4_ = (int)auVar32._16_4_;
          auVar46._0_16_ = auVar40;
          auVar46._20_4_ = (int)auVar32._20_4_;
          auVar46._24_4_ = (int)auVar32._24_4_;
          auVar46._28_4_ = (int)auVar32._28_4_;
          auVar48 = vpslld_avx(auVar40,0x17);
          auVar40 = vpslld_avx(auVar46._16_16_,0x17);
          auVar43._8_4_ = 0x3f800000;
          auVar43._0_8_ = 0x3f8000003f800000;
          auVar43._12_4_ = 0x3f800000;
          auVar40 = vpaddd_avx(auVar40,auVar43);
          auVar48 = vpaddd_avx(auVar48,auVar43);
          auVar33._0_4_ =
               auVar53._0_4_ +
               (auVar53._0_4_ + fVar28 +
               fVar28 * fVar28 *
               (((((fVar28 * 0.00019875691 + 0.0013981999) * fVar28 + 0.008333452) * fVar28 +
                 0.041665796) * fVar28 + 0.16666666) * fVar28 + 0.5)) * auVar48._0_4_;
          auVar33._4_4_ =
               auVar53._4_4_ +
               (auVar53._4_4_ + fVar34 +
               fVar34 * fVar34 *
               (((((fVar34 * 0.00019875691 + 0.0013981999) * fVar34 + 0.008333452) * fVar34 +
                 0.041665796) * fVar34 + 0.16666666) * fVar34 + 0.5)) * auVar48._4_4_;
          auVar33._8_4_ =
               auVar53._8_4_ +
               (auVar53._8_4_ + fVar35 +
               fVar35 * fVar35 *
               (((((fVar35 * 0.00019875691 + 0.0013981999) * fVar35 + 0.008333452) * fVar35 +
                 0.041665796) * fVar35 + 0.16666666) * fVar35 + 0.5)) * auVar48._8_4_;
          auVar33._12_4_ =
               auVar53._12_4_ +
               (auVar53._12_4_ + fVar36 +
               fVar36 * fVar36 *
               (((((fVar36 * 0.00019875691 + 0.0013981999) * fVar36 + 0.008333452) * fVar36 +
                 0.041665796) * fVar36 + 0.16666666) * fVar36 + 0.5)) * auVar48._12_4_;
          auVar33._16_4_ =
               auVar53._16_4_ +
               (auVar53._16_4_ + fVar37 +
               fVar37 * fVar37 *
               (((((fVar37 * 0.00019875691 + 0.0013981999) * fVar37 + 0.008333452) * fVar37 +
                 0.041665796) * fVar37 + 0.16666666) * fVar37 + 0.5)) * auVar40._0_4_;
          auVar33._20_4_ =
               auVar53._20_4_ +
               (auVar53._20_4_ + fVar38 +
               fVar38 * fVar38 *
               (((((fVar38 * 0.00019875691 + 0.0013981999) * fVar38 + 0.008333452) * fVar38 +
                 0.041665796) * fVar38 + 0.16666666) * fVar38 + 0.5)) * auVar40._4_4_;
          auVar33._24_4_ =
               auVar53._24_4_ +
               (auVar53._24_4_ + fVar39 +
               fVar39 * fVar39 *
               (((((fVar39 * 0.00019875691 + 0.0013981999) * fVar39 + 0.008333452) * fVar39 +
                 0.041665796) * fVar39 + 0.16666666) * fVar39 + 0.5)) * auVar40._8_4_;
          auVar33._28_4_ = auVar53._28_4_ + auVar53._28_4_ + auVar3._28_4_ + -0.6931472 + -0.6931472
          ;
          auVar32 = vrcpps_avx(auVar33);
          fVar28 = auVar17._0_4_ * auVar32._0_4_;
          fVar34 = auVar17._4_4_ * auVar32._4_4_;
          fVar35 = auVar17._8_4_ * auVar32._8_4_;
          fVar36 = auVar17._12_4_ * auVar32._12_4_;
          fVar37 = auVar17._16_4_ * auVar32._16_4_;
          fVar38 = auVar17._20_4_ * auVar32._20_4_;
          fVar39 = auVar17._24_4_ * auVar32._24_4_;
          auVar3._4_4_ = auVar33._4_4_ * fVar34;
          auVar3._0_4_ = auVar33._0_4_ * fVar28;
          auVar3._8_4_ = auVar33._8_4_ * fVar35;
          auVar3._12_4_ = auVar33._12_4_ * fVar36;
          auVar3._16_4_ = auVar33._16_4_ * fVar37;
          auVar3._20_4_ = auVar33._20_4_ * fVar38;
          auVar3._24_4_ = auVar33._24_4_ * fVar39;
          auVar3._28_4_ = auVar33._28_4_;
          auVar17 = vsubps_avx(auVar17,auVar3);
          *(float *)*pauVar12 = fVar28 + auVar32._0_4_ * auVar17._0_4_;
          *(float *)(*pauVar12 + 4) = fVar34 + auVar32._4_4_ * auVar17._4_4_;
          *(float *)(*pauVar12 + 8) = fVar35 + auVar32._8_4_ * auVar17._8_4_;
          *(float *)(*pauVar12 + 0xc) = fVar36 + auVar32._12_4_ * auVar17._12_4_;
          *(float *)(*pauVar12 + 0x10) = fVar37 + auVar32._16_4_ * auVar17._16_4_;
          *(float *)(*pauVar12 + 0x14) = fVar38 + auVar32._20_4_ * auVar17._20_4_;
          *(float *)(*pauVar12 + 0x18) = fVar39 + auVar32._24_4_ * auVar17._24_4_;
          *(float *)(*pauVar12 + 0x1c) = auVar17._28_4_ + 0.0;
          pauVar12 = pauVar12 + 1;
          iVar6 = iVar6 + 8;
          uVar7 = uVar10 & 0xfffffff8;
        } while (iVar6 < (int)uVar10);
      }
      auVar48._8_4_ = 0x3f800000;
      auVar48._0_8_ = 0x3f8000003f800000;
      auVar48._12_4_ = 0x3f800000;
      auVar51._8_4_ = 0x42b0c0a5;
      auVar51._0_8_ = 0x42b0c0a542b0c0a5;
      auVar51._12_4_ = 0x42b0c0a5;
      auVar52._8_4_ = 0xc2b0c0a5;
      auVar52._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar52._12_4_ = 0xc2b0c0a5;
      uVar9 = uVar7 | 3;
      while ((int)uVar9 < (int)uVar10) {
        auVar40 = *(undefined1 (*) [16])*pauVar12;
        auVar29._0_8_ = auVar40._0_8_ ^ 0x8000000080000000;
        auVar29._8_4_ = -auVar40._8_4_;
        auVar29._12_4_ = -auVar40._12_4_;
        auVar43 = vminps_avx(auVar51,auVar29);
        auVar27 = vmaxps_avx(auVar52,auVar43);
        auVar41._0_4_ = auVar27._0_4_ * 1.442695 + 0.5;
        auVar41._4_4_ = auVar27._4_4_ * 1.442695 + 0.5;
        auVar41._8_4_ = auVar27._8_4_ * 1.442695 + 0.5;
        auVar41._12_4_ = auVar27._12_4_ * 1.442695 + 0.5;
        auVar49._0_4_ = (int)auVar41._0_4_;
        auVar49._4_4_ = (int)auVar41._4_4_;
        auVar49._8_4_ = (int)auVar41._8_4_;
        auVar49._12_4_ = (int)auVar41._12_4_;
        auVar29 = vcvtdq2ps_avx(auVar49);
        auVar43 = vcmpps_avx(auVar41,auVar29,1);
        auVar43 = vandps_avx(auVar43,auVar48);
        auVar43 = vsubps_avx(auVar29,auVar43);
        fVar28 = auVar27._0_4_ + auVar43._0_4_ * -0.6931472;
        fVar34 = auVar27._4_4_ + auVar43._4_4_ * -0.6931472;
        fVar35 = auVar27._8_4_ + auVar43._8_4_ * -0.6931472;
        fVar36 = auVar27._12_4_ + auVar43._12_4_ * -0.6931472;
        auVar42._0_4_ = (int)auVar43._0_4_;
        auVar42._4_4_ = (int)auVar43._4_4_;
        auVar42._8_4_ = (int)auVar43._8_4_;
        auVar42._12_4_ = (int)auVar43._12_4_;
        auVar43 = vpslld_avx(auVar42,0x17);
        auVar43 = vpaddd_avx(auVar43,auVar48);
        auVar27._0_4_ =
             (fVar28 + 1.0 +
             fVar28 * fVar28 *
             (((((fVar28 * 0.00019875691 + 0.0013981999) * fVar28 + 0.008333452) * fVar28 +
               0.041665796) * fVar28 + 0.16666666) * fVar28 + 0.5)) * auVar43._0_4_ + 1.0;
        auVar27._4_4_ =
             (fVar34 + 1.0 +
             fVar34 * fVar34 *
             (((((fVar34 * 0.00019875691 + 0.0013981999) * fVar34 + 0.008333452) * fVar34 +
               0.041665796) * fVar34 + 0.16666666) * fVar34 + 0.5)) * auVar43._4_4_ + 1.0;
        auVar27._8_4_ =
             (fVar35 + 1.0 +
             fVar35 * fVar35 *
             (((((fVar35 * 0.00019875691 + 0.0013981999) * fVar35 + 0.008333452) * fVar35 +
               0.041665796) * fVar35 + 0.16666666) * fVar35 + 0.5)) * auVar43._8_4_ + 1.0;
        auVar27._12_4_ =
             (fVar36 + 1.0 +
             fVar36 * fVar36 *
             (((((fVar36 * 0.00019875691 + 0.0013981999) * fVar36 + 0.008333452) * fVar36 +
               0.041665796) * fVar36 + 0.16666666) * fVar36 + 0.5)) * auVar43._12_4_ + 1.0;
        auVar43 = vrcpps_avx(auVar27);
        fVar28 = auVar40._0_4_ * auVar43._0_4_;
        fVar34 = auVar40._4_4_ * auVar43._4_4_;
        fVar35 = auVar40._8_4_ * auVar43._8_4_;
        fVar36 = auVar40._12_4_ * auVar43._12_4_;
        auVar30._0_4_ = auVar27._0_4_ * fVar28;
        auVar30._4_4_ = auVar27._4_4_ * fVar34;
        auVar30._8_4_ = auVar27._8_4_ * fVar35;
        auVar30._12_4_ = auVar27._12_4_ * fVar36;
        auVar40 = vsubps_avx(auVar40,auVar30);
        *(float *)*pauVar12 = fVar28 + auVar43._0_4_ * auVar40._0_4_;
        *(float *)(*pauVar12 + 4) = fVar34 + auVar43._4_4_ * auVar40._4_4_;
        *(float *)(*pauVar12 + 8) = fVar35 + auVar43._8_4_ * auVar40._8_4_;
        *(float *)(*pauVar12 + 0xc) = fVar36 + auVar43._12_4_ * auVar40._12_4_;
        pauVar12 = (undefined1 (*) [32])(*pauVar12 + 0x10);
        uVar9 = uVar7 + 7;
        uVar7 = uVar7 + 4;
      }
      auVar5._8_8_ = 0x8000000000000000;
      auVar5._0_8_ = 0x8000000000000000;
      auVar40 = vpcmpeqd_avx(auVar48,auVar48);
      if ((int)uVar7 < (int)uVar10) {
        uVar8 = CONCAT44(0,~uVar7 + uVar10);
        auVar14._8_8_ = 0;
        auVar14._0_8_ = uVar8;
        auVar51 = vpshufd_avx(auVar14,0x44);
        auVar48 = vpor_avx(auVar51,auVar5);
        auVar43 = vpor_avx(auVar51,auVar5);
        uVar13 = 0;
        auVar44 = _DAT_00519960;
        do {
          auVar1._8_8_ = 0x8000000000000000;
          auVar1._0_8_ = 0x8000000000000000;
          auVar15._8_8_ = 0;
          auVar15._0_8_ = uVar13;
          auVar52 = vpshufd_avx(auVar15,0x44);
          auVar17._16_16_ = auVar52;
          auVar17._0_16_ = auVar52;
          auVar50 = vorps_avx(auVar17,_DAT_00519940);
          auVar44 = vorps_avx(auVar17,auVar44);
          auVar27 = vpor_avx(auVar51,auVar1);
          auVar52 = vpcmpgtq_avx(auVar44._16_16_ ^ auVar1,auVar27);
          auVar29 = vpcmpgtq_avx(auVar44._0_16_ ^ auVar1,auVar48);
          auVar52 = vpackssdw_avx(auVar29,auVar52);
          auVar29 = vpcmpgtq_avx(auVar50._16_16_ ^ auVar1,auVar27);
          auVar31._0_8_ = auVar50._0_8_ ^ 0x8000000000000000;
          auVar31._8_4_ = auVar50._8_4_;
          auVar31._12_4_ = auVar50._12_4_ ^ 0x80000000;
          auVar27 = vpcmpgtq_avx(auVar31,auVar43);
          auVar29 = vpackssdw_avx(auVar27,auVar29);
          auVar52 = vpackssdw_avx(auVar29 ^ auVar40,auVar52 ^ auVar40);
          auVar29 = vpmovsxwd_avx(auVar52);
          auVar52 = vpunpckhwd_avx(auVar52,auVar52);
          auVar18._16_16_ = auVar52;
          auVar18._0_16_ = auVar29;
          auVar17 = vmaskmovps_avx(auVar18,*(undefined1 (*) [32])(*pauVar12 + uVar13 * 4));
          auVar16._0_8_ = auVar17._0_8_ ^ 0x8000000080000000;
          auVar16._8_4_ = -auVar17._8_4_;
          auVar16._12_4_ = -auVar17._12_4_;
          auVar19._16_4_ = -auVar17._16_4_;
          auVar19._0_16_ = auVar16;
          auVar19._20_4_ = -auVar17._20_4_;
          auVar19._24_4_ = -auVar17._24_4_;
          auVar19._28_4_ = auVar17._28_4_ ^ 0x80000000;
          auVar27 = auVar19._16_16_;
          local_128._0_4_ = expf(auVar19._16_4_);
          local_128._4_4_ = extraout_XMM0_Db;
          local_128._8_4_ = extraout_XMM0_Dc;
          local_128._12_4_ = extraout_XMM0_Dd;
          auVar52 = vpermilps_avx(auVar27,0xf5);
          auVar53._0_4_ = expf(auVar52._0_4_);
          auVar53._4_60_ = extraout_var;
          auVar52 = vinsertps_avx(local_128,auVar53._0_16_,0x10);
          auVar29 = vpermilps_avx(auVar27,0x4e);
          auVar22._0_4_ = expf(auVar29._0_4_);
          auVar22._4_60_ = extraout_var_00;
          auVar52 = vinsertps_avx(auVar52,auVar22._0_16_,0x20);
          auVar29 = vpermilps_avx(auVar27,0xff);
          auVar23._0_4_ = expf(auVar29._0_4_);
          auVar23._4_60_ = extraout_var_01;
          auVar52 = vinsertps_avx(auVar52,auVar23._0_16_,0x30);
          local_d8 = (float)auVar16._0_8_;
          fVar47 = 0.0;
          local_128._0_4_ = expf(local_d8);
          local_128._4_4_ = extraout_XMM0_Db_00;
          local_128._8_4_ = extraout_XMM0_Dc_00;
          local_128._12_4_ = extraout_XMM0_Dd_00;
          auVar29 = vpermilps_avx(auVar16,0xf5);
          auVar24._0_4_ = expf(auVar29._0_4_);
          auVar24._4_60_ = extraout_var_02;
          auVar29 = vinsertps_avx(local_128,auVar24._0_16_,0x10);
          auVar27 = vpermilps_avx(auVar16,0x4e);
          auVar25._0_4_ = expf(auVar27._0_4_);
          auVar25._4_60_ = extraout_var_03;
          auVar29 = vinsertps_avx(auVar29,auVar25._0_16_,0x20);
          auVar27 = vpermilps_avx(auVar16,0xff);
          auVar26._0_4_ = expf(auVar27._0_4_);
          auVar44 = _DAT_00519960;
          auVar26._4_60_ = extraout_var_04;
          auVar40 = vpcmpeqd_avx(auVar40,auVar40);
          auVar53 = ZEXT3264(CONCAT428(0x3f800000,
                                       CONCAT424(0x3f800000,
                                                 CONCAT420(0x3f800000,
                                                           CONCAT416(0x3f800000,
                                                                     CONCAT412(0x3f800000,
                                                                               CONCAT48(0x3f800000,
                                                                                                                                                                                
                                                  0x3f8000003f800000)))))));
          auVar29 = vinsertps_avx(auVar29,auVar26._0_16_,0x30);
          auVar20._0_4_ = auVar29._0_4_ + 1.0;
          auVar20._4_4_ = auVar29._4_4_ + 1.0;
          auVar20._8_4_ = auVar29._8_4_ + 1.0;
          auVar20._12_4_ = auVar29._12_4_ + 1.0;
          auVar20._16_4_ = auVar52._0_4_ + 1.0;
          auVar20._20_4_ = auVar52._4_4_ + 1.0;
          auVar20._24_4_ = auVar52._8_4_ + 1.0;
          auVar20._28_4_ = auVar52._12_4_ + 1.0;
          auVar50 = vrcpps_avx(auVar20);
          fVar28 = auVar17._0_4_ * auVar50._0_4_;
          fVar34 = auVar17._4_4_ * auVar50._4_4_;
          fVar35 = auVar17._8_4_ * auVar50._8_4_;
          fVar36 = auVar17._12_4_ * auVar50._12_4_;
          fVar37 = auVar17._16_4_ * auVar50._16_4_;
          fVar38 = auVar17._20_4_ * auVar50._20_4_;
          fVar39 = auVar17._24_4_ * auVar50._24_4_;
          auVar4._4_4_ = auVar20._4_4_ * fVar34;
          auVar4._0_4_ = auVar20._0_4_ * fVar28;
          auVar4._8_4_ = auVar20._8_4_ * fVar35;
          auVar4._12_4_ = auVar20._12_4_ * fVar36;
          auVar4._16_4_ = auVar20._16_4_ * fVar37;
          auVar4._20_4_ = auVar20._20_4_ * fVar38;
          auVar4._24_4_ = auVar20._24_4_ * fVar39;
          auVar4._28_4_ = auVar20._28_4_;
          auVar17 = vsubps_avx(auVar17,auVar4);
          auVar21._0_4_ = fVar28 + auVar50._0_4_ * auVar17._0_4_;
          auVar21._4_4_ = fVar34 + auVar50._4_4_ * auVar17._4_4_;
          auVar21._8_4_ = fVar35 + auVar50._8_4_ * auVar17._8_4_;
          auVar21._12_4_ = fVar36 + auVar50._12_4_ * auVar17._12_4_;
          auVar21._16_4_ = fVar37 + auVar50._16_4_ * auVar17._16_4_;
          auVar21._20_4_ = fVar38 + auVar50._20_4_ * auVar17._20_4_;
          auVar21._24_4_ = fVar39 + auVar50._24_4_ * auVar17._24_4_;
          auVar21._28_4_ = fVar47 + auVar17._28_4_;
          auVar50 = vmaskmovps_avx(auVar18,auVar21);
          *(undefined1 (*) [32])(*pauVar12 + uVar13 * 4) = auVar50;
          uVar13 = uVar13 + 8;
        } while ((uVar8 + 8 & 0xfffffffffffffff8) != uVar13);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != iVar2);
  }
  return 0;
}

Assistant:

int Swish_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        __m512 _zero_avx512 = _mm512_setzero_ps();
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_div_ps(_p, _mm512_add_ps(_one_avx512, exp512_ps(_mm512_sub_ps(_zero_avx512, _p))));
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _one_avx = _mm256_set1_ps(1.f);
        __m256 _zero_avx = _mm256_setzero_ps();
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_div_ps(_p, _mm256_add_ps(_one_avx, exp256_ps(_mm256_sub_ps(_zero_avx, _p))));
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _one = _mm_set1_ps(1.f);
        __m128 _zero = _mm_setzero_ps();
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = _mm_div_ps(_p, _mm_add_ps(_one, exp_ps(_mm_sub_ps(_zero, _p))));
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *ptr / (1.f + exp(-*ptr));
            ptr++;
        }
    }

    return 0;
}